

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::popCount(Literal *__return_storage_ptr__,Literal *this)

{
  bool bVar1;
  int iVar2;
  BasicType local_20 [2];
  Literal *local_18;
  Literal *this_local;
  
  local_20[1] = 2;
  local_18 = this;
  this_local = __return_storage_ptr__;
  bVar1 = wasm::Type::operator==(&this->type,local_20 + 1);
  if (bVar1) {
    iVar2 = Bits::popCount((this->field_0).i32);
    Literal(__return_storage_ptr__,iVar2);
  }
  else {
    local_20[0] = i64;
    bVar1 = wasm::Type::operator==(&this->type,local_20);
    if (!bVar1) {
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x29e);
    }
    iVar2 = Bits::popCount((this->field_0).i64);
    Literal(__return_storage_ptr__,(long)iVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::popCount() const {
  if (type == Type::i32) {
    return Literal((int32_t)Bits::popCount(i32));
  }
  if (type == Type::i64) {
    return Literal((int64_t)Bits::popCount(i64));
  }
  WASM_UNREACHABLE("invalid type");
}